

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.hpp
# Opt level: O1

void __thiscall
duckdb::DynamicFilter::DynamicFilter
          (DynamicFilter *this,shared_ptr<duckdb::DynamicFilterData,_true> *filter_data_p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_TableFilter).filter_type = DYNAMIC_FILTER;
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)&PTR__DynamicFilter_0248f188;
  (this->filter_data).internal.
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (filter_data_p->internal).
           super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (filter_data_p->internal).
           super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (filter_data_p->internal).
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filter_data).internal.
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->filter_data).internal.
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (filter_data_p->internal).
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

explicit TableFilter(TableFilterType filter_type_p) : filter_type(filter_type_p) {
	}